

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_relation.cpp
# Opt level: O1

string * __thiscall
duckdb::TableRelation::GetAlias_abi_cxx11_(string *__return_storage_ptr__,TableRelation *this)

{
  pointer pcVar1;
  pointer pTVar2;
  
  pTVar2 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
           ::operator->(&this->description);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (pTVar2->table)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (pTVar2->table)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string TableRelation::GetAlias() {
	return description->table;
}